

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osd_0.c
# Opt level: O0

int osd_0_solve(mod2sparse *A,mod2sparse *L,mod2sparse *U,int *cols,int *rows,char *synd,
               char *osd0_decoding,double *log_prob_ratios,int A_rank,int post_processing)

{
  bool bVar1;
  int iVar2;
  char *z;
  long in_RCX;
  undefined4 *in_RDI;
  mod2sparse *in_R8;
  mod2sparse *in_R9;
  int i_2;
  int i_1;
  int in_pivot;
  int counter;
  int check;
  int i;
  int *orig_cols;
  int in_stack_00000020;
  int k;
  int N;
  int M;
  int local_68;
  int local_64;
  uint in_stack_ffffffffffffffa0;
  uint in_stack_ffffffffffffffa4;
  int iVar3;
  int in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffac;
  int iVar4;
  double *in_stack_ffffffffffffffb0;
  undefined4 in_stack_ffffffffffffffb8;
  int iVar5;
  undefined4 uVar6;
  int local_4;
  
  uVar6 = *in_RDI;
  iVar5 = in_RDI[1];
  iVar2 = iVar5 - (int)orig_cols;
  soft_decision_col_sort
            (in_stack_ffffffffffffffb0,
             (int *)CONCAT44(in_stack_ffffffffffffffac,in_stack_ffffffffffffffa8),
             in_stack_ffffffffffffffa4);
  z = (char *)chk_alloc(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0);
  for (iVar4 = 0; iVar4 < iVar5; iVar4 = iVar4 + 1) {
    *(undefined4 *)(z + (long)iVar4 * 4) = *(undefined4 *)(in_RCX + (long)iVar4 * 4);
  }
  mod2sparse_decomp_osd(L,U._4_4_,(mod2sparse *)cols,(mod2sparse *)rows,(int *)synd,_N);
  if (in_stack_00000020 == 1) {
    iVar3 = 0;
    for (local_64 = 0; local_64 < iVar5; local_64 = local_64 + 1) {
      in_stack_ffffffffffffffa8 = *(int *)(z + (long)local_64 * 4);
      bVar1 = false;
      for (local_68 = 0; local_68 < (int)orig_cols; local_68 = local_68 + 1) {
        if (*(int *)(in_RCX + (long)local_68 * 4) == in_stack_ffffffffffffffa8) {
          bVar1 = true;
          break;
        }
      }
      if (!bVar1) {
        *(int *)(in_RCX + (long)(iVar3 + (int)orig_cols) * 4) = in_stack_ffffffffffffffa8;
        iVar3 = iVar3 + 1;
      }
    }
  }
  LU_forward_backward_solve
            (in_R8,in_R9,(int *)CONCAT44(uVar6,iVar5),
             (int *)CONCAT44(iVar2,in_stack_ffffffffffffffb8),z,
             (char *)CONCAT44(iVar4,in_stack_ffffffffffffffa8));
  free(z);
  return local_4;
}

Assistant:

int osd_0_solve(
          mod2sparse *A, //parity check matrix
          mod2sparse *L,
          mod2sparse *U,
          int *cols,
          int *rows,
          char *synd,
          char *osd0_decoding,
          double *log_prob_ratios,
          int A_rank,
          int post_processing) {

      int M = mod2sparse_rows(A);
      int N = mod2sparse_cols(A);
      int k = N - A_rank;

      //sort columns on the basis of soft decisions
      soft_decision_col_sort(log_prob_ratios, cols, N);

      //save the original sorted column list
      int *orig_cols = chk_alloc(N, sizeof(*rows));
      for (int i = 0; i < N; i++) {
          orig_cols[i] = cols[i];
      }

      //Performs LU decomposition of the parity check matrix.
      mod2sparse_decomp_osd
              (A,    /* Input matrix, M by N */
               A_rank,        /* Size of sub-matrix to find LU decomposition of */
               L,    /* Matrix in which L is stored, M by A_rank */
               U,    /* Matrix in which U is stored, A_rank by N */
               rows,        /* Array where row indexes are stored, M long */
               cols        /* Array where column indexes are stored, N long */
              );

      //this next step is necessary to ensure the bits outside of the info set are ordered according to the soft decisions. The decomp function scrambles them!
      if(post_processing==1) {
          //sort the bits outside the info set
          int check;
          int counter = 0;
          int in_pivot;
          for (int i = 0; i < N; i++) {
              check = orig_cols[i];
              in_pivot = 0;
              for (int i = 0; i < A_rank; i++) {
                  if (cols[i] == check) {
                      in_pivot = 1;
                      break;
                  }
              }

              if (in_pivot == 0) {
                  cols[counter + A_rank] = check;
                  counter = counter + 1;
              }

          }

      }

      //solve the syndrome equation using forwards/backwards substitution. This function also reverts the bit string to its original ordering.
      LU_forward_backward_solve(
              L,
              U,
              rows,
              cols,
              synd,
              osd0_decoding);


      //cleanup
      free(orig_cols);

  }